

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void nodeGetCell(Rtree *pRtree,RtreeNode *pNode,int iCell,RtreeCell *pCell)

{
  i64 iVar1;
  int local_3c;
  int ii;
  RtreeCoord *pCoord;
  u8 *pData;
  RtreeCell *pCell_local;
  int iCell_local;
  RtreeNode *pNode_local;
  Rtree *pRtree_local;
  
  local_3c = 0;
  iVar1 = nodeGetRowid(pRtree,pNode,iCell);
  pCell->iRowid = iVar1;
  pCoord = (RtreeCoord *)(pNode->zData + (int)((uint)pRtree->nBytesPerCell * iCell + 0xc));
  do {
    readCoord((u8 *)&pCoord->u,pCell->aCoord + local_3c);
    readCoord((u8 *)&pCoord[1].u,pCell->aCoord + (local_3c + 1));
    pCoord = pCoord + 2;
    local_3c = local_3c + 2;
  } while (local_3c < (int)(uint)pRtree->nDim2);
  return;
}

Assistant:

static void nodeGetCell(
  Rtree *pRtree,               /* The overall R-Tree */
  RtreeNode *pNode,            /* The node containing the cell to be read */
  int iCell,                   /* Index of the cell within the node */
  RtreeCell *pCell             /* OUT: Write the cell contents here */
){
  u8 *pData;
  RtreeCoord *pCoord;
  int ii = 0;
  pCell->iRowid = nodeGetRowid(pRtree, pNode, iCell);
  pData = pNode->zData + (12 + pRtree->nBytesPerCell*iCell);
  pCoord = pCell->aCoord;
  do{
    readCoord(pData, &pCoord[ii]);
    readCoord(pData+4, &pCoord[ii+1]);
    pData += 8;
    ii += 2;
  }while( ii<pRtree->nDim2 );
}